

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCache.cpp
# Opt level: O2

void BinaryCache::AddImportPath(char *path)

{
  undefined *puVar1;
  int iVar2;
  char **ppcVar3;
  size_t sVar4;
  uint i;
  uint index;
  char *importPath;
  char *local_20;
  
  index = 0;
  do {
    puVar1 = NULLC::alloc;
    if (_DAT_0022728c <= index) {
      sVar4 = strlen(path);
      local_20 = (char *)(*(code *)puVar1)((int)sVar4 + 1);
      strcpy(local_20,path);
      FastVector<char_*,_false,_false>::push_back
                ((FastVector<char_*,_false,_false> *)&importPaths,&local_20);
      return;
    }
    ppcVar3 = FastVector<char_*,_false,_false>::operator[]
                        ((FastVector<char_*,_false,_false> *)&importPaths,index);
    iVar2 = strcmp(*ppcVar3,path);
    index = index + 1;
  } while (iVar2 != 0);
  return;
}

Assistant:

void BinaryCache::AddImportPath(const char* path)
{
	for(unsigned int i = 0; i < importPaths.size(); i++)
	{
		if(strcmp(importPaths[i], path) == 0)
			return;
	}

	char *importPath = (char*)NULLC::alloc(int(strlen(path)) + 1);
	strcpy(importPath, path);
	importPaths.push_back(importPath);
}